

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_canvas.cpp
# Opt level: O1

pair<float,_float> sinStrokeFunction(Coordf x0,Coordf x1)

{
  pair<float,_float> pVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = sinf(((x0 + -0.086) / 0.211) * 6.283184);
  fVar3 = sinf(((x1 + -0.086) / 0.211) * 6.283184);
  pVar1.second = fVar3 * -0.072 + 0.422;
  pVar1.first = fVar2 * -0.072 + 0.422;
  return pVar1;
}

Assistant:

std::pair<Coordf,Coordf> sinStrokeFunction(Coordf x0, Coordf x1) {
    // To understand the apparently random numbers below (0.422, 0.072, 0.086),
    // see line 135
    Coordf base = 0.422f - 0.072f*std::sin(2*3.141592f*((x0 - 0.086f)/0.211f));
    Coordf end  = 0.422f - 0.072f*std::sin(2*3.141592f*((x1 - 0.086f)/0.211f));

    // When stroke width (end - base) maps to less than 1px, it will be
    // rounded automatically to 1px
    return std::make_pair(base, end);
}